

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O2

TestStatus *
vkt::geometry::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,TestParams_conflict params)

{
  ProgramCollection<vk::ProgramBinary> *pPVar1;
  TestLog *log;
  void *data;
  VkImageSubresourceRange subresourceRange;
  undefined1 auVar2 [16];
  VkExtent2D VVar3;
  Context *pCVar4;
  VkDevice device;
  bool bVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  int iVar8;
  VkResult result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  DeviceInterface *vk;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  Allocator *allocator;
  TextureFormat format;
  ProgramBinary *pPVar10;
  ostream *poVar11;
  NotSupportedError *this;
  undefined1 *puVar12;
  TestStatus *pTVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  ulong uVar17;
  undefined4 uVar18;
  uint local_790;
  VkImageViewType local_784;
  RefBase<vk::VkCommandBuffer_s_*> local_778;
  TestStatus *local_758;
  Context *local_750;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  Vector<float,_4> local_6f8;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_6e8;
  undefined1 *local_6c8;
  undefined1 *puStack_6c0;
  VkQueue local_6b8;
  VkDevice local_6b0;
  VkViewport res_1;
  VkAttachmentReference colorAttachmentRef;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_648;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_628;
  VkImageSubresourceRange res;
  VkRect2D scissor;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  undefined1 local_5b8 [16];
  PFN_vkReallocationFunction local_5a8;
  PFN_vkFreeFunction p_Stack_5a0;
  undefined1 local_598 [16];
  undefined8 local_588;
  undefined1 local_580 [16];
  undefined8 local_570;
  VkCompareOp local_568;
  undefined1 local_564 [16];
  float local_554;
  VkImageCreateInfo imageParams;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_3c8;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_3a8;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_388;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_368;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_348;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_328;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_308;
  ConstPixelBufferAccess layerImage;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  undefined1 local_258 [32];
  VkPipelineVertexInputStateCreateInfo *local_238;
  VkImageCreateInfo *local_230;
  VkPipelineTessellationStateCreateInfo *local_228;
  VkPipelineViewportStateCreateInfo *local_220;
  VkPipelineRasterizationStateCreateInfo *local_218;
  VkPipelineMultisampleStateCreateInfo *local_210;
  VkPipelineDepthStencilStateCreateInfo *local_208;
  VkPipelineColorBlendStateCreateInfo *local_200;
  VkPipelineDynamicStateCreateInfo *local_1f8;
  VkPipelineLayout local_1f0;
  VkRenderPass local_1e8;
  deUint32 local_1e0;
  VkPipeline local_1d8;
  deInt32 local_1d0;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkClearValue clearValue;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  
  local_758 = __return_storage_ptr__;
  if ((ulong)params.image.viewType == 2) {
    pvVar9 = Context::getDeviceExtensions_abi_cxx11_(context);
    imageParams._0_8_ =
         (pvVar9->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = Context::getDeviceExtensions_abi_cxx11_(context);
    local_258._0_8_ =
         (pvVar9->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = de::
            contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[20]>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&imageParams,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_258,(char (*) [20])0x9d0973);
    if (!bVar5) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"Extension VK_KHR_maintenance1 not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryLayeredRenderingTests.cpp"
                 ,0x381);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_790 = 0x20;
    local_784 = VK_IMAGE_VIEW_TYPE_2D_ARRAY;
  }
  else {
    local_790 = 0;
    local_784 = params.image.viewType;
  }
  vk = Context::getDeviceInterface(context);
  vki = Context::getInstanceInterface(context);
  local_6b0 = Context::getDevice(context);
  physDevice = Context::getPhysicalDevice(context);
  dVar6 = Context::getUniversalQueueFamilyIndex(context);
  local_6b8 = Context::getUniversalQueue(context);
  local_750 = context;
  allocator = Context::getDefaultAllocator(context);
  checkGeometryShaderSupport(vki,physDevice,0);
  dVar7 = params.image.numLayers;
  if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
    dVar7 = params.image.size.depth;
  }
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar8 = tcu::getPixelSize(format);
  device = local_6b0;
  if (params.image.viewType < VK_IMAGE_VIEW_TYPE_LAST) {
    imageParams.imageType = *(VkImageType *)(&DAT_00a0ce14 + (ulong)params.image.viewType * 4);
  }
  else {
    imageParams.imageType = VK_IMAGE_TYPE_LAST;
  }
  VVar3 = params.image.size._0_8_;
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags =
       (uint)(params.image.viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY ||
             params.image.viewType == VK_IMAGE_VIEW_TYPE_CUBE) << 4 | local_790;
  imageParams.format = VK_FORMAT_R8G8B8A8_UNORM;
  imageParams.extent.depth = params.image.size.depth;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = params.image.numLayers;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0x11;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams._64_8_ = imageParams._64_8_ & 0xffffffff00000000;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams._80_8_ = imageParams._80_8_ & 0xffffffff00000000;
  imageParams.extent.width = params.image.size.width;
  imageParams.extent.height = params.image.size.height;
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)local_258,vk,local_6b0,&imageParams);
  local_6e8.m_data.deleter.m_device = (VkDevice)local_258._16_8_;
  local_6e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_258._24_8_;
  local_6e8.m_data.object.m_internal = local_258._0_8_;
  local_6e8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_258._8_8_;
  local_258._0_4_ = R;
  local_258._4_4_ = SNORM_INT8;
  local_258._8_8_ = (DeviceInterface *)0x0;
  local_258._16_8_ = (VkDevice)0x0;
  local_258._24_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_258);
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,vk,device,
            allocator,(VkImage)local_6e8.m_data.object.m_internal,(MemoryRequirement)0x0);
  colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)imageParams._0_8_;
  pCVar4 = local_750;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams);
  res.aspectMask = 1;
  res.baseMipLevel = 0;
  res.levelCount = 1;
  res.baseArrayLayer = 0;
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = dVar7;
  res.layerCount = dVar7;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&imageParams,vk,device,
                (VkImage)local_6e8.m_data.object.m_internal,local_784,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  uVar14 = (ulong)(params.image.numLayers * params.image.size.depth * params.image.size.width *
                   params.image.size.height * iVar8);
  local_308.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_308.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_308.m_data.object.m_internal = imageParams._0_8_;
  local_308.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&imageParams);
  makeBufferCreateInfo((VkBufferCreateInfo *)&imageParams,uVar14,2);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_258,vk,device,
             (VkBufferCreateInfo *)&imageParams);
  local_628.m_data.deleter.m_device = (VkDevice)local_258._16_8_;
  local_628.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_258._24_8_;
  local_628.m_data.object.m_internal = local_258._0_8_;
  local_628.m_data.deleter.m_deviceIface = (DeviceInterface *)local_258._8_8_;
  local_258._0_4_ = R;
  local_258._4_4_ = SNORM_INT8;
  local_258._8_8_ = (DeviceInterface *)0x0;
  local_258._16_8_ = (VkDevice)0x0;
  local_258._24_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_258);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,vk,device,
             allocator,(VkBuffer)local_628.m_data.object.m_internal,(MemoryRequirement)0x1);
  colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
       = (Allocation *)imageParams._0_8_;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams);
  pPVar1 = pCVar4->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_258,"vert",(allocator<char> *)local_5b8);
  pPVar10 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)local_258);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageParams,vk,device,pPVar10,0);
  local_328.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_328.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_328.m_data.object.m_internal = imageParams._0_8_;
  local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&imageParams);
  std::__cxx11::string::~string((string *)local_258);
  pPVar1 = pCVar4->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_258,"geom",(allocator<char> *)local_5b8);
  pPVar10 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)local_258);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageParams,vk,device,pPVar10,0);
  local_348.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_348.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_348.m_data.object.m_internal = imageParams._0_8_;
  local_348.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&imageParams);
  std::__cxx11::string::~string((string *)local_258);
  pPVar1 = pCVar4->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_258,"frag",(allocator<char> *)local_5b8);
  pPVar10 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar1,(string *)local_258);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&imageParams,vk,device,pPVar10,0);
  local_368.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_368.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_368.m_data.object.m_internal = imageParams._0_8_;
  local_368.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&imageParams);
  std::__cxx11::string::~string((string *)local_258);
  local_5b8._0_8_ = (void *)0x2500000000;
  local_5b8._8_8_ = (PFN_vkAllocationFunction)0x100000001;
  local_5a8 = (PFN_vkReallocationFunction)0x200000000;
  p_Stack_5a0 = (PFN_vkFreeFunction)0x1;
  local_598._0_4_ = 2;
  imageParams.extent._4_8_ = &colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.extent.width = 0;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  imageParams.samples = 0;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  local_258._0_4_ = 0x26;
  local_258._8_8_ = (DeviceInterface *)0x0;
  local_258._16_8_ = &DAT_100000000;
  local_258._24_8_ = local_5b8;
  local_238 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(local_238._4_4_,1);
  local_228 = (VkPipelineTessellationStateCreateInfo *)((ulong)local_228 & 0xffffffff00000000);
  local_220 = (VkPipelineViewportStateCreateInfo *)0x0;
  imageParams.format = VK_FORMAT_R4G4_UNORM_PACK8;
  local_230 = &imageParams;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineRasterizationStateInfo,vk,device,
             (VkRenderPassCreateInfo *)local_258,(VkAllocationCallbacks *)0x0);
  local_648.m_data.object.m_internal =
       CONCAT44(pipelineRasterizationStateInfo._4_4_,pipelineRasterizationStateInfo.sType);
  local_648.m_data.deleter.m_device = (VkDevice)pipelineRasterizationStateInfo._16_8_;
  local_648.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pipelineRasterizationStateInfo._24_8_;
  pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineRasterizationStateInfo._4_4_ = 0;
  pipelineRasterizationStateInfo.pNext._0_4_ = 0;
  pipelineRasterizationStateInfo.pNext._4_4_ = 0;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 0;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&pipelineRasterizationStateInfo);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&imageParams,vk,device,
                  (VkRenderPass)local_648.m_data.object.m_internal,
                  (VkImageView)local_308.m_data.object.m_internal,params.image.size.width,
                  params.image.size.height,dVar7);
  local_388.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_388.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_388.m_data.object.m_internal = imageParams._0_8_;
  local_388.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&imageParams);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&imageParams,vk,device,
                     (VkDescriptorSetLayout)0x0);
  local_3a8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  local_3a8.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_3a8.m_data.object.m_internal = imageParams._0_8_;
  local_3a8.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&imageParams);
  res_1.width = (float)((ulong)VVar3 & 0xffffffff);
  res_1.height = (float)((ulong)VVar3 >> 0x20);
  pipelineViewportStateInfo.pViewports = &res_1;
  res_1.x = 0.0;
  res_1.y = 0.0;
  pipelineViewportStateInfo.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  local_220 = &pipelineViewportStateInfo;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.pNext = (void *)0x0;
  res_1.minDepth = 0.0;
  res_1.maxDepth = 1.0;
  pipelineViewportStateInfo.flags = 0;
  pipelineViewportStateInfo.viewportCount = 1;
  pipelineRasterizationStateInfo._4_4_ = 0;
  pipelineRasterizationStateInfo.pNext._0_4_ = 0;
  pipelineRasterizationStateInfo.pNext._4_4_ = 0;
  pipelineRasterizationStateInfo.depthBiasClamp = 0.0;
  pipelineRasterizationStateInfo.depthBiasSlopeFactor = 0.0;
  pipelineRasterizationStateInfo.cullMode = 0;
  pipelineRasterizationStateInfo.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  pipelineRasterizationStateInfo.depthBiasEnable = 0;
  pipelineRasterizationStateInfo.depthBiasConstantFactor = 0.0;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 0;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_210 = &pipelineMultisampleStateInfo;
  pipelineMultisampleStateInfo.pNext = (void *)0x0;
  pipelineMultisampleStateInfo.sampleShadingEnable = 0;
  pipelineMultisampleStateInfo.minSampleShading = 0.0;
  pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)0x0;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0;
  pipelineMultisampleStateInfo.alphaToOneEnable = 0;
  pipelineMultisampleStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  pipelineMultisampleStateInfo._4_4_ = 0;
  pipelineMultisampleStateInfo.flags = 0;
  pipelineMultisampleStateInfo.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_5b8._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_5b8._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_5a8 = (PFN_vkReallocationFunction)0x0;
  local_598 = ZEXT416(0);
  p_Stack_5a0 = (PFN_vkFreeFunction)&DAT_100000000;
  local_588._0_4_ = VK_STENCIL_OP_KEEP;
  local_588._4_4_ = VK_COMPARE_OP_ALWAYS;
  imageParams.samples = VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_2_BIT;
  imageParams.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  pipelineRasterizationStateInfo.lineWidth = 1.0;
  pipelineRasterizationStateInfo._60_4_ = 0;
  local_570._0_4_ = VK_STENCIL_OP_KEEP;
  local_570._4_4_ = VK_STENCIL_OP_KEEP;
  local_568 = VK_COMPARE_OP_ALWAYS;
  imageParams.format = (VkFormat)local_328.m_data.object.m_internal;
  imageParams.extent.width = (deUint32)(local_328.m_data.object.m_internal >> 0x20);
  imageParams.extent.height = 0x989565;
  imageParams.extent.depth = 0;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.usage = 0;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_554 = 1.0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 8;
  imageParams.pQueueFamilyIndices = (deUint32 *)local_348.m_data.object.m_internal;
  colorAttachmentRef.attachment = 0x1a;
  imageParams._80_8_ = (long)"pre_main" + 4;
  local_258._0_4_ = sBGR|sR;
  local_258._8_8_ = (DeviceInterface *)0x0;
  local_258._16_8_ = (VkDevice)0x300000000;
  local_238 = &vertexInputStateInfo;
  vertexInputStateInfo._0_16_ = ZEXT416(0x13);
  local_230 = (VkImageCreateInfo *)&pipelineInputAssemblyStateInfo;
  pipelineInputAssemblyStateInfo.flags = 0;
  pipelineInputAssemblyStateInfo.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  local_228 = (VkPipelineTessellationStateCreateInfo *)0x0;
  local_208 = (VkPipelineDepthStencilStateCreateInfo *)local_5b8;
  local_200 = (VkPipelineColorBlendStateCreateInfo *)&colorAttachmentRef;
  local_1f8 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_1f0.m_internal = local_3a8.m_data.object.m_internal;
  local_1e8.m_internal = local_648.m_data.object.m_internal;
  pipelineColorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.alphaBlendOp = VK_BLEND_OP_ADD;
  pipelineColorBlendAttachmentState.colorWriteMask = 0xf;
  pipelineColorBlendAttachmentState.blendEnable = 0;
  pipelineColorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_ADD;
  local_1e0 = 0;
  local_1d8.m_internal = 0;
  local_1d0 = 0;
  scissor.extent = VVar3;
  local_580 = local_598;
  local_564 = local_598;
  local_258._24_8_ = &imageParams;
  local_218 = &pipelineRasterizationStateInfo;
  vertexInputStateInfo._16_16_ = local_598;
  vertexInputStateInfo._32_16_ = local_598;
  pipelineViewportStateInfo.scissorCount = VK_FORMAT_R4G4_UNORM_PACK8;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&layerImage,vk,device,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)local_258,(VkAllocationCallbacks *)0x0);
  local_3c8.m_data.object.m_internal._0_4_ = layerImage.m_format.order;
  local_3c8.m_data.object.m_internal._4_4_ = layerImage.m_format.type;
  local_3c8.m_data.deleter.m_deviceIface = (DeviceInterface *)layerImage.m_size.m_data._0_8_;
  local_3c8.m_data.deleter.m_device = (VkDevice)layerImage._16_8_;
  local_3c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)layerImage.m_pitch.m_data._4_8_;
  layerImage.m_format.order = R;
  layerImage.m_format.type = SNORM_INT8;
  layerImage.m_size.m_data[0] = 0;
  layerImage.m_size.m_data[1] = 0;
  layerImage.m_size.m_data[2] = 0;
  layerImage.m_pitch.m_data[0] = 0;
  layerImage.m_pitch.m_data[1] = 0;
  layerImage.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&layerImage);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&imageParams,vk,device,2,dVar6,
             (VkAllocationCallbacks *)0x0);
  scissor.offset.x = imageParams.sType;
  scissor.offset.y = imageParams._4_4_;
  scissor.extent = (VkExtent2D)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&imageParams);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&imageParams,vk,device,(VkCommandPool)scissor.offset,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_778.m_data.deleter.m_pool.m_internal = CONCAT44(imageParams.extent.width,imageParams.format)
  ;
  local_778.m_data.deleter.m_device = (VkDevice)imageParams._16_8_;
  local_778.m_data.object = (VkCommandBuffer_s *)imageParams._0_8_;
  local_778.m_data.deleter.m_deviceIface = (DeviceInterface *)imageParams.pNext;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&imageParams);
  zeroBuffer(vk,device,
             colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
             m_data.ptr,uVar14);
  beginCommandBuffer(vk,local_778.m_data.object);
  clearValue._0_4_ = 0.0;
  clearValue._4_4_ = 0;
  clearValue._8_8_ = 0x3f80000000000000;
  local_5b8._0_4_ = 0x2b;
  local_5b8._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_5a8 = (PFN_vkReallocationFunction)local_648.m_data.object.m_internal;
  p_Stack_5a0 = (PFN_vkFreeFunction)local_388.m_data.object.m_internal;
  auVar2._8_8_ = 0;
  auVar2._0_4_ = VVar3.width;
  auVar2._4_4_ = VVar3.height;
  local_598 = auVar2 << 0x40;
  local_588._0_4_ = VK_STENCIL_OP_ZERO;
  local_580._0_8_ = &clearValue;
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_778.m_data.object,local_5b8,0);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_778.m_data.object,0,local_3c8.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_778.m_data.object,1,1,0,0);
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_778.m_data.object);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x100;
  imageParams.imageType = 0x800;
  imageParams.format = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
  imageParams.extent.width = 6;
  imageParams.extent.height = 0xffffffff;
  imageParams.extent.depth = 0xffffffff;
  imageParams.mipLevels = (deUint32)local_6e8.m_data.object.m_internal;
  imageParams.arrayLayers = (deUint32)(local_6e8.m_data.object.m_internal >> 0x20);
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 1;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = params.image.numLayers;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_778.m_data.object,0x400,0x1000,0,0,0,0,0,1,&imageParams);
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 1;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.extent.width = params.image.numLayers;
  imageParams.extent.height = 0;
  imageParams.extent.depth = 0;
  imageParams.mipLevels = 0;
  imageParams.tiling = params.image.size.depth;
  uVar18 = SUB84(&imageParams,0);
  imageParams.arrayLayers = params.image.size.width;
  imageParams.samples = params.image.size.height;
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_778.m_data.object,local_6e8.m_data.object.m_internal,6,
             local_628.m_data.object.m_internal,1,uVar18);
  imageParams.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x1000;
  imageParams.imageType = 0x2000;
  imageParams.format = ~VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0xffffffff;
  imageParams.extent.height = (deUint32)local_628.m_data.object.m_internal;
  imageParams.extent.depth = (deUint32)(local_628.m_data.object.m_internal >> 0x20);
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.samples = 0xffffffff;
  imageParams.tiling = ~VK_IMAGE_TILING_OPTIMAL;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_778.m_data.object,0x1000,0x4000,0,0,0,1,uVar18,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_778.m_data.object);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryLayeredRenderingTests.cpp"
                    ,0x3fc);
  submitCommandsAndWait(vk,device,local_6b8,local_778.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((colorBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.ptr)->m_offset,uVar14);
  log = local_750->m_testCtx->m_log;
  data = (colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
          m_data.ptr)->m_hostPtr;
  pipelineRasterizationStateInfo.sType = params.image.size.width;
  if ((params.image.viewType == VK_IMAGE_VIEW_TYPE_1D) ||
     (params.image.viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY)) {
    pipelineRasterizationStateInfo._4_4_ = 1;
    pipelineRasterizationStateInfo.pNext._0_4_ = 1;
    pipelineRasterizationStateInfo.pNext._4_4_ = params.image.numLayers;
    imageParams._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&pipelineRasterizationStateInfo.flags,
               (TextureFormat *)&imageParams,params.image.size.width,params.image.numLayers,1,data);
  }
  else {
    if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
      params.image.numLayers = params.image.size.depth;
    }
    pipelineRasterizationStateInfo.pNext._0_4_ = 0;
    pipelineRasterizationStateInfo._4_4_ = params.image.size.height;
    pipelineRasterizationStateInfo.pNext._4_4_ = params.image.numLayers;
    imageParams._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&pipelineRasterizationStateInfo.flags,
               (TextureFormat *)&imageParams,params.image.size.width,params.image.size.height,
               params.image.numLayers,data);
  }
  uVar14 = 0;
  puVar12 = geometry::(anonymous_namespace)::s_colors;
  dVar7 = 0;
  do {
    iVar8 = (int)uVar14;
    if ((int)pipelineRasterizationStateInfo.pNext._4_4_ <= iVar8) {
      if (dVar7 == pipelineRasterizationStateInfo.pNext._4_4_) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&imageParams,"OK",(allocator<char> *)local_258);
        pTVar13 = local_758;
        tcu::TestStatus::pass(local_758,(string *)&imageParams);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&imageParams,"Rendered images are incorrect",
                   (allocator<char> *)local_258);
        pTVar13 = local_758;
        tcu::TestStatus::fail(local_758,(string *)&imageParams);
      }
      std::__cxx11::string::~string((string *)&imageParams);
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_778);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
                ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&scissor);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_3c8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_3a8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_388);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_648);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_368);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_348);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_328);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&colorBufferAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_628);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_308);
      de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                (&colorImageAlloc.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_6e8);
      return pTVar13;
    }
    tcu::getSubregion(&layerImage,(ConstPixelBufferAccess *)&pipelineRasterizationStateInfo.flags,0,
                      (uint)pipelineRasterizationStateInfo.pNext * iVar8,
                      (~(uint)pipelineRasterizationStateInfo.pNext & 1) * iVar8,
                      pipelineRasterizationStateInfo.sType,pipelineRasterizationStateInfo._4_4_,1);
    imageParams._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&imageParams.pNext);
    std::operator<<((ostream *)&imageParams.pNext,"Verifying ");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
    pcVar16 = "slice z = ";
    if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
LAB_008a6fb8:
      poVar11 = std::operator<<((ostream *)local_258,pcVar16);
      iVar15 = iVar8;
    }
    else {
      if ((params.image.viewType != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) &&
         (params.image.viewType != VK_IMAGE_VIEW_TYPE_CUBE)) {
        pcVar16 = "layer ";
        goto LAB_008a6fb8;
      }
      poVar11 = std::operator<<((ostream *)local_258,"cube ");
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)((uVar14 & 0xffffffff) / 6));
      poVar11 = std::operator<<(poVar11,", face ");
      iVar15 = (int)((uVar14 & 0xffffffff) % 6);
    }
    std::ostream::operator<<(poVar11,iVar15);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
    std::operator<<((ostream *)&imageParams.pNext,(string *)&colorAttachmentRef);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&imageParams,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&colorAttachmentRef);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&imageParams.pNext);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&res_1,&layerImage);
    dVar6 = pipelineRasterizationStateInfo.pNext._4_4_;
    local_6c8 = &DAT_3f8000003f800000;
    puStack_6c0 = &DAT_3f8000003f800000;
    switch(params.testType) {
    case TEST_TYPE_DEFAULT_LAYER:
      if (iVar8 == 0) {
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&imageParams,(ConstPixelBufferAccess *)&res_1);
        bVar5 = verifyImageSingleColoredRow
                          (log,(ConstPixelBufferAccess *)&imageParams,0.5,(Vec4 *)&local_6c8);
      }
      else {
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_258,(ConstPixelBufferAccess *)&res_1);
        bVar5 = verifyEmptyImage(log,(ConstPixelBufferAccess *)local_258);
      }
      break;
    case TEST_TYPE_SINGLE_LAYER:
      if (iVar8 == (int)pipelineRasterizationStateInfo.pNext._4_4_ / 2) {
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&colorAttachmentRef,(ConstPixelBufferAccess *)&res_1);
        bVar5 = verifyImageSingleColoredRow
                          (log,(ConstPixelBufferAccess *)&colorAttachmentRef,0.5,(Vec4 *)&local_6c8)
        ;
      }
      else {
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&vertexInputStateInfo,(ConstPixelBufferAccess *)&res_1)
        ;
        bVar5 = verifyEmptyImage(log,(ConstPixelBufferAccess *)&vertexInputStateInfo);
      }
      break;
    case TEST_TYPE_ALL_LAYERS:
    case TEST_TYPE_INVOCATION_PER_LAYER:
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&pipelineViewportStateInfo,
                 (ConstPixelBufferAccess *)&res_1);
      tcu::Vector<float,_4>::Vector(&local_6f8,(float (*) [4])(puVar12 + (uVar14 / 6) * -0x60));
      bVar5 = verifyImageSingleColoredRow
                        (log,(ConstPixelBufferAccess *)&pipelineViewportStateInfo,0.5,&local_6f8);
      break;
    case TEST_TYPE_DIFFERENT_CONTENT:
    case TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION:
      if (iVar8 == 0) {
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&pipelineMultisampleStateInfo,
                   (ConstPixelBufferAccess *)&res_1);
        bVar5 = verifyEmptyImage(log,(ConstPixelBufferAccess *)&pipelineMultisampleStateInfo);
      }
      else {
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&pipelineInputAssemblyStateInfo,
                   (ConstPixelBufferAccess *)&res_1);
        bVar5 = verifyImageSingleColoredRow
                          (log,(ConstPixelBufferAccess *)&pipelineInputAssemblyStateInfo,
                           (float)iVar8 / (float)(int)dVar6,(Vec4 *)&local_6c8);
      }
      break;
    case TEST_TYPE_LAYER_ID:
      local_6f8.m_data[2] = 1.0;
      if (iVar8 != 0) {
        local_6f8.m_data[2] = 0.0;
      }
      uVar17 = CONCAT44(-(uint)((uVar14 & 2) == 0),-(uint)((uVar14 & 1) == 0));
      local_6f8.m_data._0_8_ = uVar17 & DAT_009638b0 | ~uVar17 & DAT_00963870;
      local_6f8.m_data[3] = 1.0;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)&pipelineColorBlendAttachmentState,
                 (ConstPixelBufferAccess *)&res_1);
      bVar5 = verifyImageSingleColoredRow
                        (log,(ConstPixelBufferAccess *)&pipelineColorBlendAttachmentState,0.5,
                         &local_6f8);
      break;
    default:
      goto switchD_008a7086_default;
    }
    if (bVar5 != false) {
      dVar7 = dVar7 + 1;
    }
switchD_008a7086_default:
    uVar14 = uVar14 + 1;
    puVar12 = puVar12 + 0x10;
  } while( true );
}

Assistant:

tcu::TestStatus test (Context& context, const TestParams params)
{
	if (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType &&
		(!de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1")))
		TCU_THROW(NotSupportedError, "Extension VK_KHR_maintenance1 not supported");

	const DeviceInterface&			vk						= context.getDeviceInterface();
	const InstanceInterface&		vki						= context.getInstanceInterface();
	const VkDevice					device					= context.getDevice();
	const VkPhysicalDevice			physDevice				= context.getPhysicalDevice();
	const deUint32					queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	const VkQueue					queue					= context.getUniversalQueue();
	Allocator&						allocator				= context.getDefaultAllocator();

	checkGeometryShaderSupport(vki, physDevice);

	const VkFormat					colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const deUint32					numLayers				= (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? params.image.size.depth : params.image.numLayers);
	const Vec4						clearColor				= Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	const VkDeviceSize				colorBufferSize			= params.image.size.width * params.image.size.height * params.image.size.depth * params.image.numLayers * tcu::getPixelSize(mapVkFormat(colorFormat));
	const VkImageCreateFlags		imageCreateFlags		= (isCubeImageViewType(params.image.viewType) ? VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : (VkImageCreateFlagBits)0) |
															  (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? VK_IMAGE_CREATE_2D_ARRAY_COMPATIBLE_BIT_KHR : (VkImageCreateFlagBits)0);
	const VkImageViewType			viewType				= (VK_IMAGE_VIEW_TYPE_3D == params.image.viewType ? VK_IMAGE_VIEW_TYPE_2D_ARRAY : params.image.viewType);

	const Unique<VkImage>			colorImage				(makeImage				(vk, device, makeImageCreateInfo(imageCreateFlags, getImageType(params.image.viewType), colorFormat, params.image.size,
																					 params.image.numLayers, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT)));
	const UniquePtr<Allocation>		colorImageAlloc			(bindImage				(vk, device, allocator, *colorImage, MemoryRequirement::Any));
	const Unique<VkImageView>		colorAttachment			(makeImageView			(vk, device, *colorImage, viewType, colorFormat, makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers)));

	const Unique<VkBuffer>			colorBuffer				(makeBuffer				(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferAlloc		(bindBuffer				(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	const Unique<VkShaderModule>	vertexModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	geometryModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("geom"), 0u));
	const Unique<VkShaderModule>	fragmentModule			(createShaderModule		(vk, device, context.getBinaryCollection().get("frag"), 0u));

	const Unique<VkRenderPass>		renderPass				(makeRenderPass			(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer				(makeFramebuffer		(vk, device, *renderPass, *colorAttachment, params.image.size.width,  params.image.size.height, numLayers));
	const Unique<VkPipelineLayout>	pipelineLayout			(makePipelineLayout		(vk, device));
	const Unique<VkPipeline>		pipeline				(makeGraphicsPipeline	(vk, device, *pipelineLayout, *renderPass, *vertexModule, *geometryModule, *fragmentModule,
																					 makeExtent2D(params.image.size.width, params.image.size.height)));
	const Unique<VkCommandPool>		cmdPool					(createCommandPool		(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer				(allocateCommandBuffer	(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	zeroBuffer(vk, device, *colorBufferAlloc, colorBufferSize);

	beginCommandBuffer(vk, *cmdBuffer);

	const VkClearValue			clearValue	= makeClearValueColor(clearColor);
	const VkRect2D				renderArea	=
	{
		makeOffset2D(0, 0),
		makeExtent2D(params.image.size.width, params.image.size.height),
	};
	const VkRenderPassBeginInfo renderPassBeginInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
		DE_NULL,										// const void*             pNext;
		*renderPass,									// VkRenderPass            renderPass;
		*framebuffer,									// VkFramebuffer           framebuffer;
		renderArea,										// VkRect2D                renderArea;
		1u,												// uint32_t                clearValueCount;
		&clearValue,									// const VkClearValue*     pClearValues;
	};
	vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuffer);

	// Prepare color image for copy
	{
		const VkImageSubresourceRange	colorSubresourceRange	= makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, params.image.numLayers);
		const VkImageMemoryBarrier		barriers[] =
		{
			{
				VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
				DE_NULL,										// const void*				pNext;
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags			outputMask;
				VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			inputMask;
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout			oldLayout;
				VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,			// VkImageLayout			newLayout;
				VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
				*colorImage,									// VkImage					image;
				colorSubresourceRange,							// VkImageSubresourceRange	subresourceRange;
			},
		};

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
	}
	// Color image -> host buffer
	{
		const VkBufferImageCopy region =
		{
			0ull,																						// VkDeviceSize                bufferOffset;
			0u,																							// uint32_t                    bufferRowLength;
			0u,																							// uint32_t                    bufferImageHeight;
			makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, params.image.numLayers),		// VkImageSubresourceLayers    imageSubresource;
			makeOffset3D(0, 0, 0),																		// VkOffset3D                  imageOffset;
			params.image.size,																			// VkExtent3D                  imageExtent;
		};

		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);
	}
	// Buffer write barrier
	{
		const VkBufferMemoryBarrier barriers[] =
		{
			{
				VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
				DE_NULL,										// const void*        pNext;
				VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
				VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
				VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
				VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
				*colorBuffer,									// VkBuffer           buffer;
				0ull,											// VkDeviceSize       offset;
				VK_WHOLE_SIZE,									// VkDeviceSize       size;
			},
		};

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), colorBufferSize);

	if (!verifyResults(context.getTestContext().getLog(), params, colorFormat, colorBufferAlloc->getHostPtr()))
		return tcu::TestStatus::fail("Rendered images are incorrect");
	else
		return tcu::TestStatus::pass("OK");
}